

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O3

int duckdb_shell_sqlite3_exec
              (sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char **__ptr;
  char **__ptr_00;
  char *pcVar4;
  uchar *puVar5;
  char **ppcVar6;
  pointer str;
  ulong uVar7;
  bool bVar8;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  sqlite3_stmt *local_68;
  char **local_60;
  char *local_58;
  char *local_50;
  sqlite3 *local_48;
  sqlite3_callback local_40;
  void *local_38;
  
  local_68 = (sqlite3_stmt *)0x0;
  local_50 = anon_var_dwarf_6372561 + 9;
  local_60 = pzErrMsg;
  local_48 = db;
  local_40 = xCallback;
  local_38 = pArg;
  if (zSql == (char *)0x0) {
    zSql = anon_var_dwarf_6372561 + 9;
  }
  do {
    if (*zSql == '\0') {
      __ptr = (char **)0x0;
      __ptr_00 = (char **)0x0;
LAB_00cfa59c:
      iVar1 = 0;
      ppcVar6 = local_60;
      goto LAB_00cfa5a3;
    }
    local_68 = (sqlite3_stmt *)0x0;
    iVar1 = duckdb_shell_sqlite3_prepare_v2(db,zSql,-1,&local_68,&local_58);
    ppcVar6 = local_60;
    if (iVar1 != 0) {
      if (local_60 != (char **)0x0) {
        if ((db == (sqlite3 *)0x0) ||
           (local_50 = (db->last_error).final_message._M_dataplus._M_p, local_50 != (char *)0x0)) {
          pcVar4 = sqlite3_strdup(local_50);
        }
        else {
          pcVar4 = (char *)0x0;
        }
        *ppcVar6 = pcVar4;
      }
      __ptr = (char **)0x0;
      __ptr_00 = (char **)0x0;
      goto LAB_00cfa5a3;
    }
    if (local_68 != (sqlite3_stmt *)0x0) {
      uVar2 = duckdb_shell_sqlite3_column_count(local_68);
      __ptr = (char **)malloc((long)(int)uVar2 << 3);
      __ptr_00 = (char **)malloc((long)(int)uVar2 << 3);
      if ((__ptr == (char **)0x0) || (__ptr_00 == (char **)0x0)) goto LAB_00cfa59c;
      if (0 < (int)uVar2) {
        uVar7 = 0;
        do {
          pcVar4 = duckdb_shell_sqlite3_column_name(local_68,(int)uVar7);
          __ptr[uVar7] = pcVar4;
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      do {
        bVar8 = local_40 != (sqlite3_callback)0x0;
        iVar1 = duckdb_shell_sqlite3_step(local_68);
        if (iVar1 == 100 && bVar8) {
          if (0 < (int)uVar2) {
            uVar7 = 0;
            do {
              puVar5 = duckdb_shell_sqlite3_column_text(local_68,(int)uVar7);
              __ptr_00[uVar7] = (char *)puVar5;
              if ((puVar5 == (uchar *)0x0) &&
                 (iVar3 = duckdb_shell_sqlite3_column_type(local_68,(int)uVar7), iVar3 != 5)) {
                duckdb_shell_sqlite3_exec_cold_1();
                iVar1 = 100;
                ppcVar6 = local_60;
                goto LAB_00cfa5a3;
              }
              uVar7 = uVar7 + 1;
            } while (uVar2 != uVar7);
          }
          iVar3 = (*local_40)(local_38,uVar2,__ptr_00,__ptr);
          if (iVar3 != 0) {
            duckdb_shell_sqlite3_exec_cold_2();
            iVar1 = 4;
            ppcVar6 = local_60;
            goto LAB_00cfa5a3;
          }
        }
        ppcVar6 = local_60;
      } while (iVar1 == 100);
      if (iVar1 == 0x65) {
        iVar1 = duckdb_shell_sqlite3_finalize(local_68);
        db = local_48;
        local_68 = (sqlite3_stmt *)0x0;
        zSql = local_58 + -1;
        do {
          pcVar4 = zSql + 1;
          zSql = zSql + 1;
          iVar3 = isspace((int)*pcVar4);
        } while (iVar3 != 0);
        free(__ptr);
        free(__ptr_00);
        goto LAB_00cfa548;
      }
      if (local_60 != (char **)0x0) {
        if (local_48 == (sqlite3 *)0x0) {
          str = anon_var_dwarf_6372561 + 9;
LAB_00cfa58c:
          pcVar4 = sqlite3_strdup(str);
        }
        else {
          str = (local_48->last_error).final_message._M_dataplus._M_p;
          if (str != (pointer)0x0) goto LAB_00cfa58c;
          pcVar4 = (char *)0x0;
        }
        *ppcVar6 = pcVar4;
      }
      goto LAB_00cfa5a3;
    }
    iVar1 = 0;
    zSql = local_58;
LAB_00cfa548:
    if (iVar1 != 0) {
      __ptr = (char **)0x0;
      __ptr_00 = (char **)0x0;
      ppcVar6 = local_60;
LAB_00cfa5a3:
      if (local_68 != (sqlite3_stmt *)0x0) {
        duckdb_shell_sqlite3_finalize(local_68);
      }
      free(__ptr);
      free(__ptr_00);
      if (((ppcVar6 != (char **)0x0) && (iVar1 != 0)) && (*ppcVar6 == (char *)0x0)) {
        pcVar4 = sqlite3_strdup("Unknown error in DuckDB!");
        *ppcVar6 = pcVar4;
      }
      return iVar1;
    }
  } while( true );
}

Assistant:

int sqlite3_exec(sqlite3 *db,                /* The database on which the SQL executes */
                 const char *zSql,           /* The SQL to be executed */
                 sqlite3_callback xCallback, /* Invoke this callback routine */
                 void *pArg,                 /* First argument to xCallback() */
                 char **pzErrMsg             /* Write error messages here */
) {
	int rc = SQLITE_OK;            /* Return code */
	const char *zLeftover;         /* Tail of unprocessed SQL */
	sqlite3_stmt *pStmt = nullptr; /* The current SQL statement */
	char **azCols = nullptr;       /* Names of result columns */
	char **azVals = nullptr;       /* Result values */

	if (zSql == nullptr) {
		zSql = "";
	}

	while (rc == SQLITE_OK && zSql[0]) {
		int nCol;

		pStmt = nullptr;
		rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
		if (rc != SQLITE_OK) {
			if (pzErrMsg) {
				auto errmsg = sqlite3_errmsg(db);
				*pzErrMsg = errmsg ? sqlite3_strdup(errmsg) : nullptr;
			}
			continue;
		}
		if (!pStmt) {
			/* this happens for a comment or white-space */
			zSql = zLeftover;
			continue;
		}

		nCol = sqlite3_column_count(pStmt);
		azCols = (char **)malloc(nCol * sizeof(const char *));
		azVals = (char **)malloc(nCol * sizeof(const char *));
		if (!azCols || !azVals) {
			goto exec_out;
		}
		for (int i = 0; i < nCol; i++) {
			azCols[i] = (char *)sqlite3_column_name(pStmt, i);
		}

		while (true) {
			rc = sqlite3_step(pStmt);

			/* Invoke the callback function if required */
			if (xCallback && rc == SQLITE_ROW) {
				for (int i = 0; i < nCol; i++) {
					azVals[i] = (char *)sqlite3_column_text(pStmt, i);
					if (!azVals[i] && sqlite3_column_type(pStmt, i) != SQLITE_NULL) {
						fprintf(stderr, "sqlite3_exec: out of memory.\n");
						goto exec_out;
					}
				}
				if (xCallback(pArg, nCol, azVals, azCols)) {
					/* EVIDENCE-OF: R-38229-40159 If the callback function to
					** sqlite3_exec() returns non-zero, then sqlite3_exec() will
					** return SQLITE_ABORT. */
					rc = SQLITE_ABORT;
					sqlite3_finalize(pStmt);
					pStmt = 0;
					fprintf(stderr, "sqlite3_exec: callback returned non-zero. "
					                "Aborting.\n");
					goto exec_out;
				}
			}
			if (rc == SQLITE_DONE) {
				rc = sqlite3_finalize(pStmt);
				pStmt = nullptr;
				zSql = zLeftover;
				while (isspace(zSql[0]))
					zSql++;
				break;
			} else if (rc != SQLITE_ROW) {
				// error
				if (pzErrMsg) {
					auto errmsg = sqlite3_errmsg(db);
					*pzErrMsg = errmsg ? sqlite3_strdup(errmsg) : nullptr;
				}
				goto exec_out;
			}
		}

		sqlite3_free(azCols);
		sqlite3_free(azVals);
		azCols = nullptr;
		azVals = nullptr;
	}

exec_out:
	if (pStmt) {
		sqlite3_finalize(pStmt);
	}
	sqlite3_free(azCols);
	sqlite3_free(azVals);
	if (rc != SQLITE_OK && pzErrMsg && !*pzErrMsg) {
		// error but no error message set
		*pzErrMsg = sqlite3_strdup("Unknown error in DuckDB!");
	}
	return rc;
}